

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

void * duckdb_yyjson::pool_malloc(void *ctx_ptr,usize size)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong uVar7;
  pool_ctx *ctx;
  
  if (size < *ctx_ptr) {
    uVar6 = size + 0xf & 0xfffffffffffffff0;
    uVar1 = uVar6 + 0x10;
    puVar4 = (ulong *)0x0;
    puVar5 = (ulong *)((long)ctx_ptr + 8);
    while (puVar2 = (ulong *)*puVar5, puVar2 != (ulong *)0x0) {
      uVar3 = *puVar2;
      if (uVar1 <= uVar3) {
        if (uVar3 < uVar6 + 0x30) {
          uVar7 = puVar2[1];
        }
        else {
          uVar7 = (long)puVar2 + uVar1;
          *(ulong *)((long)puVar2 + uVar1) = uVar3 - uVar1;
          *(ulong *)((long)puVar2 + uVar6 + 0x18) = puVar2[1];
          *puVar2 = uVar1;
        }
        puVar5 = puVar4 + 1;
        if (puVar4 == (ulong *)0x0) {
          puVar5 = (ulong *)((long)ctx_ptr + 8);
        }
        *puVar5 = uVar7;
        return puVar2 + 2;
      }
      puVar4 = puVar2;
      puVar5 = puVar2 + 1;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *pool_malloc(void *ctx_ptr, usize size) {
    /* assert(size != 0) */
    pool_ctx *ctx = (pool_ctx *)ctx_ptr;
    pool_chunk *next, *prev = NULL, *cur = ctx->free_list;

    if (unlikely(size >= ctx->size)) return NULL;
    pool_size_align(&size);

    while (cur) {
        if (cur->size < size) {
            /* not enough space, try next chunk */
            prev = cur;
            cur = cur->next;
            continue;
        }
        if (cur->size >= size + sizeof(pool_chunk) * 2) {
            /* too much space, split this chunk */
            next = (pool_chunk *)(void *)((u8 *)cur + size);
            next->size = cur->size - size;
            next->next = cur->next;
            cur->size = size;
        } else {
            /* just enough space, use whole chunk */
            next = cur->next;
        }
        if (prev) prev->next = next;
        else ctx->free_list = next;
        return (void *)(cur + 1);
    }
    return NULL;
}